

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_dec.c
# Opt level: O2

WebPInputFileFormat WebPGuessImageType(uint8_t *data,size_t data_size)

{
  uint32_t uVar1;
  uint32_t uVar2;
  WebPInputFileFormat WVar3;
  
  WVar3 = WEBP_UNSUPPORTED_FORMAT;
  if (0xb < data_size && data != (uint8_t *)0x0) {
    uVar1 = GetBE32(data);
    uVar2 = GetBE32(data + 8);
    WVar3 = WEBP_PNG_FORMAT;
    if (uVar1 != 0x89504e47) {
      if ((uVar1 & 0xffffff00) == 0xffd8ff00) {
        WVar3 = WEBP_JPEG_FORMAT;
      }
      else {
        WVar3 = WEBP_TIFF_FORMAT;
        if ((uVar1 != 0x49492a00) && (uVar1 != 0x4d4d002a)) {
          if (uVar2 == 0x57454250 && uVar1 == 0x52494646) {
            WVar3 = WEBP_WEBP_FORMAT;
          }
          else {
            WVar3 = WEBP_UNSUPPORTED_FORMAT;
            if ((uVar1 & 0xff000000) == 0x50000000) {
              WVar3 = WEBP_UNSUPPORTED_FORMAT - ((uVar1 >> 0x10 & 0xff) - 0x35 < 3);
            }
          }
        }
      }
    }
  }
  return WVar3;
}

Assistant:

WebPInputFileFormat WebPGuessImageType(const uint8_t* const data,
                                       size_t data_size) {
  WebPInputFileFormat format = WEBP_UNSUPPORTED_FORMAT;
  if (data != NULL && data_size >= 12) {
    const uint32_t magic1 = GetBE32(data + 0);
    const uint32_t magic2 = GetBE32(data + 8);
    if (magic1 == 0x89504E47U) {
      format = WEBP_PNG_FORMAT;
    } else if (magic1 >= 0xFFD8FF00U && magic1 <= 0xFFD8FFFFU) {
      format = WEBP_JPEG_FORMAT;
    } else if (magic1 == 0x49492A00 || magic1 == 0x4D4D002A) {
      format = WEBP_TIFF_FORMAT;
    } else if (magic1 == 0x52494646 && magic2 == 0x57454250) {
      format = WEBP_WEBP_FORMAT;
    } else if (((magic1 >> 24) & 0xff) == 'P') {
      const int type = (magic1 >> 16) & 0xff;
      // we only support 'P5 -> P7' for now.
      if (type >= '5' && type <= '7') format = WEBP_PNM_FORMAT;
    }
  }
  return format;
}